

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::SimpleTypeHandler<1UL>::IsWritable
          (SimpleTypeHandler<1UL> *this,DynamicObject *instance,PropertyId propertyId)

{
  BOOL BVar1;
  ushort local_26;
  PropertyId local_24;
  PropertyIndex index;
  DynamicObject *pDStack_20;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  SimpleTypeHandler<1UL> *this_local;
  
  local_24 = propertyId;
  pDStack_20 = instance;
  instance_local = (DynamicObject *)this;
  BVar1 = GetDescriptor(this,propertyId,&local_26);
  if (BVar1 == 0) {
    this_local._4_4_ = 1;
  }
  else {
    this_local._4_4_ = this->descriptors[local_26].field_1.Attributes & 4;
  }
  return this_local._4_4_;
}

Assistant:

BOOL SimpleTypeHandler<size>::IsWritable(DynamicObject* instance, PropertyId propertyId)
    {
        PropertyIndex index;
        if (!GetDescriptor(propertyId, &index))
        {
            return true;
        }
        return descriptors[index].Attributes & PropertyWritable;
    }